

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1591.c
# Opt level: O0

int trailers_callback(curl_slist **list,void *userdata)

{
  long lVar1;
  curl_slist *local_30;
  curl_slist *nlist2;
  curl_slist *nlist;
  void *userdata_local;
  curl_slist **list_local;
  
  local_30 = (curl_slist *)0x0;
  lVar1 = curl_slist_append(*list,"my-super-awesome-trailer: trail1");
  if (lVar1 != 0) {
    local_30 = (curl_slist *)curl_slist_append(lVar1,"my-other-awesome-trailer: trail2");
  }
  if (local_30 == (curl_slist *)0x0) {
    curl_slist_free_all(lVar1);
  }
  else {
    *list = local_30;
  }
  list_local._4_4_ = (uint)(local_30 == (curl_slist *)0x0);
  return list_local._4_4_;
}

Assistant:

static int trailers_callback(struct curl_slist **list, void *userdata)
{
  struct curl_slist *nlist = NULL;
  struct curl_slist *nlist2 = NULL;
  (void)userdata;
  nlist = curl_slist_append(*list, "my-super-awesome-trailer: trail1");
  if(nlist)
    nlist2 = curl_slist_append(nlist, "my-other-awesome-trailer: trail2");
  if(nlist2) {
    *list = nlist2;
    return CURL_TRAILERFUNC_OK;
  }
  else {
    curl_slist_free_all(nlist);
    return CURL_TRAILERFUNC_ABORT;
  }
}